

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  ImGuiID *pIVar2;
  long in_RDI;
  ImGuiTable *in_stack_00000010;
  ImGuiTableColumnSortSpecs *sort_spec;
  ImGuiTableColumn *column;
  int column_n;
  ImGuiTableColumnSortSpecs *sort_specs;
  undefined8 in_stack_ffffffffffffffb8;
  int new_size;
  ImVector<ImGuiTableColumnSortSpecs> *in_stack_ffffffffffffffc0;
  long lVar3;
  int local_14;
  
  new_size = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  TableSortSpecsSanitize(in_stack_00000010);
  ImVector<ImGuiTableColumnSortSpecs>::resize(in_stack_ffffffffffffffc0,new_size);
  if (*(char *)(in_RDI + 0x230) == '\0') {
    lVar3 = 0;
  }
  else if (*(char *)(in_RDI + 0x230) == '\x01') {
    lVar3 = in_RDI + 0x200;
  }
  else {
    lVar3 = *(long *)(in_RDI + 0x218);
  }
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x6c); local_14 = local_14 + 1) {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),local_14);
    if (pIVar1->SortOrder != -1) {
      pIVar2 = (ImGuiID *)(lVar3 + (long)pIVar1->SortOrder * 0xc);
      *pIVar2 = pIVar1->UserID;
      *(short *)(pIVar2 + 1) = (short)(char)local_14;
      *(short *)((long)pIVar2 + 6) = (short)pIVar1->SortOrder;
      *(byte *)(pIVar2 + 2) = pIVar1->field_0x64 & 3;
    }
  }
  *(long *)(in_RDI + 0x220) = lVar3;
  *(int *)(in_RDI + 0x228) = (int)*(char *)(in_RDI + 0x230);
  *(undefined1 *)(in_RDI + 0x22c) = 1;
  *(undefined1 *)(in_RDI + 0x24b) = 0;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsMulti.resize(table->SortSpecsCount <= 1 ? 0 : table->SortSpecsCount);
    ImGuiTableColumnSortSpecs* sort_specs = (table->SortSpecsCount == 0) ? NULL : (table->SortSpecsCount == 1) ? &table->SortSpecsSingle : table->SortSpecsMulti.Data;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        IM_ASSERT(column->SortOrder < table->SortSpecsCount);
        ImGuiTableColumnSortSpecs* sort_spec = &sort_specs[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImGuiTableColumnIdx)column_n;
        sort_spec->SortOrder = (ImGuiTableColumnIdx)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
    }
    table->SortSpecs.Specs = sort_specs;
    table->SortSpecs.SpecsCount = table->SortSpecsCount;
    table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
    table->IsSortSpecsDirty = false; // Mark as not dirty for us
}